

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_eval_context(sexp ctx,sexp stack,sexp env,sexp_uint_t size,sexp_uint_t max_size)

{
  sexp psVar1;
  sexp psVar2;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  long in_RDI;
  sexp in_R8;
  sexp in_stack_00000008;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  undefined1 *in_stack_ffffffffffffffb8;
  sexp in_stack_ffffffffffffffc0;
  size_t max_size_00;
  sexp local_8;
  
  max_size_00 = 0x43e;
  memset(&stack0xffffffffffffffb8,0,0x10);
  local_8 = sexp_make_context(in_RCX,(size_t)in_R8,max_size_00);
  if ((local_8 != (sexp)0x0) && ((((ulong)local_8 & 3) != 0 || (local_8->tag != 0x13)))) {
    if (in_RDI != 0) {
      in_stack_ffffffffffffffb8 = &stack0xffffffffffffffc8;
      in_stack_ffffffffffffffc0 = *(sexp *)(in_RDI + 0x6080);
      *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffb8;
    }
    psVar2 = in_RDX;
    if (in_RDX == (sexp)0x0) {
      in_RDX = sexp_make_primitive_env_op
                         (res,(sexp)__sexp_gc_preserver1.next,(sexp_sint_t)__sexp_gc_preserver1.var,
                          in_stack_00000008);
    }
    (local_8->value).string.offset = (sexp_uint_t)in_RDX;
    psVar1 = sexp_make_vector_op(in_RSI,psVar2,(sexp_sint_t)in_RCX,in_R8,local_8);
    (local_8->value).opcode.methods = psVar1;
    (((local_8->value).opcode.methods)->value).bytecode.length = 0x3e;
    (((local_8->value).opcode.methods)->value).uvector.length = 0x23e;
    psVar1 = sexp_alloc_tagged_aux
                       (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8,
                        (sexp_uint_t)in_RDX);
    (((local_8->value).opcode.methods)->value).type.cpl = psVar1;
    if ((((local_8->value).string.offset & 3) == 0) && (((local_8->value).type.cpl)->tag == 0x13)) {
      local_8 = (local_8->value).type.cpl;
    }
    else if ((((local_8->value).port.size & 3) == 0) &&
            (((local_8->value).opcode.methods)->tag == 0x13)) {
      local_8 = (sexp)(local_8->value).port.size;
    }
    else if ((((((local_8->value).opcode.methods)->value).string.offset & 3) == 0) &&
            (((((local_8->value).opcode.methods)->value).type.cpl)->tag == 0x13)) {
      local_8 = (((local_8->value).opcode.methods)->value).type.cpl;
    }
    else {
      (((((local_8->value).opcode.methods)->value).type.cpl)->value).flonum = 3.06320700421573e-322;
      (((((local_8->value).opcode.methods)->value).type.cpl)->value).bytecode.length = 0x80;
      (((((local_8->value).opcode.methods)->value).type.cpl)->value).string.offset = 0x23e;
      (((((local_8->value).opcode.methods)->value).type.cpl)->value).uvector.length = 0x23e;
      if ((in_RSI == (sexp)0x0) || (in_RSI == (sexp)&DAT_0000003e)) {
        in_RSI = sexp_alloc_tagged_aux
                           (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8,
                            (sexp_uint_t)in_RDX);
        if ((((ulong)in_RSI & 3) == 0) && (in_RSI->tag == 0x13)) {
          if (in_RDI == 0) {
            return in_RSI;
          }
          *(sexp *)(in_RDI + 0x6080) = in_stack_ffffffffffffffc0;
          return in_RSI;
        }
        (in_RSI->value).flonum = 5.05923221341436e-321;
        (in_RSI->value).type.cpl = (sexp)0x0;
      }
      (local_8->value).type.name = in_RSI;
      if (in_RDI == 0) {
        sexp_init_eval_context_globals(in_RDX);
        psVar2 = sexp_make_vector_op(in_RSI,psVar2,(sexp_sint_t)in_RCX,in_R8,local_8);
        (local_8->value).type.id = psVar2;
        (((local_8->value).type.id)->value).string.offset = 1;
      }
      else {
        (local_8->value).type.print = *(sexp *)(in_RDI + 0x38);
        (local_8->value).flonum_bits[0x60a1] = *(char *)(in_RDI + 0x60a9);
        (local_8->value).type.id = *(sexp *)(in_RDI + 0x30);
        *(sexp *)(in_RDI + 0x6080) = in_stack_ffffffffffffffc0;
      }
    }
  }
  return local_8;
}

Assistant:

sexp sexp_make_eval_context (sexp ctx, sexp stack, sexp env, sexp_uint_t size, sexp_uint_t max_size) {
  sexp_gc_var1(res);
  res = sexp_make_context(ctx, size, max_size);
  if (!res || sexp_exceptionp(res))
    return res;
  if (ctx) sexp_gc_preserve1(ctx, res);
  sexp_context_env(res) = (env ? env : sexp_make_primitive_env(res, SEXP_SEVEN));
  sexp_context_specific(res) = sexp_make_vector(res, SEXP_SEVEN, SEXP_ZERO);
  sexp_context_lambda(res) = SEXP_FALSE;
  sexp_context_fv(res) = SEXP_NULL;
  sexp_context_bc(res) = sexp_alloc_bytecode(res, SEXP_INIT_BCODE_SIZE);
  if (sexp_exceptionp(sexp_context_env(res))) {
    res = sexp_context_env(res);
  } else if (sexp_exceptionp(sexp_context_specific(res))) {
    res = sexp_context_specific(res);
  } else if (sexp_exceptionp(sexp_context_bc(res))) {
    res = sexp_context_bc(res);
  } else {
    sexp_bytecode_name(sexp_context_bc(res)) = SEXP_FALSE;
    sexp_bytecode_length(sexp_context_bc(res)) = SEXP_INIT_BCODE_SIZE;
    sexp_bytecode_literals(sexp_context_bc(res)) = SEXP_NULL;
    sexp_bytecode_source(sexp_context_bc(res)) = SEXP_NULL;
    if ((! stack) || (stack == SEXP_FALSE)) {
      stack = sexp_alloc_tagged(res, SEXP_STACK_SIZE, SEXP_STACK);
      if (sexp_exceptionp(stack)) {
        if (ctx) sexp_gc_release1(ctx);
        return stack;
      } else {
        sexp_stack_length(stack) = SEXP_INIT_STACK_SIZE;
        sexp_stack_top(stack) = 0;
      }
    }
    sexp_context_stack(res) = stack;
    if (! ctx) sexp_init_eval_context_globals(res);
    if (ctx) {
      sexp_context_params(res) = sexp_context_params(ctx);
      sexp_context_tracep(res) = sexp_context_tracep(ctx);
      sexp_context_dk(res) = sexp_context_dk(ctx);
      sexp_gc_release1(ctx);
    } else {
      /* TODO: make the root a global (with friendly error in/out) */
      sexp_context_dk(res) = sexp_make_vector(res, SEXP_FOUR, SEXP_FALSE);
      sexp_vector_set(sexp_context_dk(res), SEXP_ZERO, SEXP_ZERO);
    }
  }
  return res;
}